

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O1

INT Silent_PAL_vsnprintf(LPSTR Buffer,INT Count,LPCSTR Format,__va_list_tag *aparg)

{
  LPCWSTR pWVar1;
  long lVar2;
  LPCWSTR lpWideCharStr;
  bool bVar3;
  char cVar4;
  BOOL BVar5;
  int iVar6;
  uint uVar7;
  errno_t eVar8;
  uint *puVar9;
  int *piVar10;
  INT *pIVar11;
  short *psVar12;
  LPSTR pCVar13;
  byte *pbVar14;
  undefined8 *puVar15;
  size_t sVar16;
  INT IVar17;
  ulong uVar18;
  long lVar19;
  LPSTR pCVar20;
  int iVar21;
  INT Count_00;
  uint Flags_00;
  int iVar22;
  long lVar23;
  long in_FS_OFFSET;
  bool bVar24;
  undefined1 auStack_5d8 [8];
  CHAR TempBuffer [4];
  uint local_5b4;
  int local_5b0;
  INT Prefix;
  INT Type;
  LPCSTR Fmt;
  INT Flags;
  int local_594;
  INT Precision;
  INT Width;
  undefined1 auStack_588 [8];
  va_list ap;
  CHAR local_568 [8];
  CHAR TempStr [301];
  CHAR TempBuff [1024];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ap[0].overflow_arg_area = aparg->reg_save_area;
  auStack_588._0_4_ = aparg->gp_offset;
  auStack_588._4_4_ = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  cVar4 = *Format;
  lVar23 = (long)Count;
  iVar21 = (int)Buffer;
  _Type = Format;
  Fmt._4_4_ = Count;
  _Precision = Buffer;
  if (cVar4 == '\0') {
    bVar24 = true;
  }
  else {
    bVar24 = false;
    do {
      if (lVar23 <= (long)_Precision - (long)Buffer) {
        bVar24 = true;
        break;
      }
      if ((cVar4 == '%') &&
         (BVar5 = Silent_ExtractFormatA
                            ((LPCSTR *)&Type,TempStr + 0x128,(LPINT)&Fmt,&local_594,&Flags,
                             (LPINT)&local_5b4,&local_5b0), Flags_00 = (uint)Fmt, iVar6 = local_5b0,
         uVar7 = local_5b4, BVar5 != 0)) {
        if (local_5b0 == 2 && (local_5b4 ^ 2) == 0) {
          if (local_594 == -3) {
            if ((uint)auStack_588._0_4_ < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
            }
            else {
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
          }
          else if (local_594 == -2) {
            uVar18 = (ulong)auStack_588 & 0xffffffff;
            if (uVar18 < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
              piVar10 = (int *)(uVar18 + (long)ap[0].overflow_arg_area);
            }
            else {
              piVar10 = (int *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            local_594 = *piVar10;
          }
          if (Flags == -4) {
            if ((uint)auStack_588._0_4_ < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
            }
            else {
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
          }
          else if (Flags == -2) {
            uVar18 = (ulong)auStack_588 & 0xffffffff;
            if (uVar18 < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
              pIVar11 = (INT *)(uVar18 + (long)ap[0].overflow_arg_area);
            }
            else {
              pIVar11 = (INT *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            Flags = *pIVar11;
          }
          uVar18 = (ulong)auStack_588 & 0xffffffff;
          if (uVar18 < 0x29) {
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
            puVar15 = (undefined8 *)(uVar18 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar15 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          lpWideCharStr = (LPCWSTR)*puVar15;
          if (lpWideCharStr == (LPCWSTR)0x0) {
            lVar19 = 0;
          }
          else if (*lpWideCharStr == L'\0') {
            lVar19 = 1;
          }
          else {
            lVar19 = 1;
            do {
              pWVar1 = lpWideCharStr + lVar19;
              lVar19 = lVar19 + 1;
            } while (*pWVar1 != L'\0');
          }
          iVar6 = (int)lVar19;
          if (iVar6 != 0) {
            IVar17 = Flags;
            if (Flags == -3) {
              IVar17 = 300;
            }
            iVar22 = iVar6 + -1;
            Flags = IVar17;
            if ((IVar17 < 1) || (iVar22 <= IVar17)) {
              iVar6 = Silent_WideCharToMultiByte(lpWideCharStr,-1,local_568,iVar6);
              if (iVar6 != 0) goto LAB_00146023;
              PAL_free(local_568);
            }
            else {
              iVar6 = Silent_WideCharToMultiByte(lpWideCharStr,IVar17,local_568,iVar6);
              if (iVar6 != 0) {
                local_568[iVar6] = '\0';
                iVar22 = IVar17;
LAB_00146023:
                pCVar20 = local_568;
                Count_00 = (iVar21 - Precision) + Fmt._4_4_;
                IVar17 = local_594 - iVar22;
                Flags_00 = (uint)Fmt;
                goto LAB_001460fc;
              }
            }
          }
LAB_00146452:
          iVar6 = -1;
          goto LAB_00146425;
        }
        if ((local_5b4 ^ 2) == 0 && local_5b0 == 1) {
          if (local_594 + 3U < 2) {
            if ((uint)auStack_588._0_4_ < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
            }
            else {
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
          }
          if ((Flags & 0xfffffffdU) == 0xfffffffc) {
            if ((uint)auStack_588._0_4_ < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
            }
            else {
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
          }
          uVar18 = (ulong)auStack_588 & 0xffffffff;
          if (uVar18 < 0x29) {
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
            puVar9 = (uint *)(uVar18 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar9 = (uint *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          auStack_5d8[0] = (byte)*puVar9;
          if ((*puVar9 & 0xff00) != 0) {
            auStack_5d8[0] = 0x3f;
          }
          auStack_5d8[1] = 0;
          Count_00 = (iVar21 - Precision) + Fmt._4_4_;
          IVar17 = local_594 + -1;
          pCVar20 = auStack_5d8;
          goto LAB_001460fc;
        }
        if (local_5b0 == 6) {
          if (local_594 == -2) {
            uVar18 = (ulong)auStack_588 & 0xffffffff;
            if (uVar18 < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
              piVar10 = (int *)(uVar18 + (long)ap[0].overflow_arg_area);
            }
            else {
              piVar10 = (int *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            local_594 = *piVar10;
          }
          if (Flags == -2) {
            uVar18 = (ulong)auStack_588 & 0xffffffff;
            if (uVar18 < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
              pIVar11 = (INT *)(uVar18 + (long)ap[0].overflow_arg_area);
            }
            else {
              pIVar11 = (INT *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            Flags = *pIVar11;
          }
          uVar18 = (ulong)auStack_588 & 0xffffffff;
          if (local_5b4 == 1) {
            if ((uint)auStack_588._0_4_ < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
              puVar15 = (undefined8 *)(uVar18 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar15 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(short *)*puVar15 = (short)((long)_Precision - (long)Buffer);
          }
          else {
            if ((uint)auStack_588._0_4_ < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
              puVar15 = (undefined8 *)(uVar18 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar15 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(int *)*puVar15 = (int)((long)_Precision - (long)Buffer);
          }
          goto LAB_0014610a;
        }
        if ((local_5b0 == 1) && (((uint)Fmt & 4) != 0)) {
          uVar18 = (ulong)auStack_588 & 0xffffffff;
          if (uVar18 < 0x29) {
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
            pbVar14 = (byte *)(uVar18 + (long)ap[0].overflow_arg_area);
          }
          else {
            pbVar14 = (byte *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          auStack_5d8[1] = 0;
          auStack_5d8[0] = *pbVar14;
          Count_00 = (iVar21 - Precision) + Fmt._4_4_;
          IVar17 = local_594 + -1;
          pCVar20 = auStack_5d8;
        }
        else {
          if ((local_5b0 != 2) || (((uint)Fmt & 4) == 0)) {
            pCVar20 = Buffer + (lVar23 - (long)_Precision);
            if ((local_5b0 == 5 && (local_5b4 ^ 1) == 0) || ((local_5b4 ^ 1) == 0 && local_5b0 == 4)
               ) {
              uVar18 = (ulong)auStack_588 & 0xffffffff;
              if (uVar18 < 0x29) {
                auStack_588._0_4_ = auStack_588._0_4_ + 8;
                psVar12 = (short *)(uVar18 + (long)ap[0].overflow_arg_area);
              }
              else {
                psVar12 = (short *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              uVar7 = snprintf(_Precision,(size_t)pCVar20,TempStr + 0x128,(ulong)(uint)(int)*psVar12
                              );
LAB_0014624f:
              if (((int)uVar7 < 0) || (pCVar13 = (LPSTR)(ulong)uVar7, pCVar20 <= pCVar13)) {
                bVar24 = true;
                pCVar13 = pCVar20;
              }
              _Precision = _Precision + (long)pCVar13;
              bVar3 = true;
            }
            else {
              if (((TempStr[0x128] != '%') || (TempStr[0x129] != 's')) ||
                 (eVar8 = strcpy_s(TempStr + 0x128,0x400,"%.300s"), eVar8 == 0)) {
                auStack_5d8 = auStack_588;
                _TempBuffer = (void *)ap[0]._0_8_;
                Prefix = PAL__vsnprintf(_Precision,(size_t)pCVar20,TempStr + 0x128,
                                        (__va_list_tag *)auStack_5d8);
                PAL_printf_arg_remover((va_list *)auStack_588,local_594,Flags,iVar6,uVar7);
                uVar7 = Prefix;
                goto LAB_0014624f;
              }
              bVar3 = false;
            }
            if (bVar3) goto LAB_0014610a;
            goto LAB_00146452;
          }
          uVar18 = (ulong)auStack_588 & 0xffffffff;
          if (uVar18 < 0x29) {
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
            puVar15 = (undefined8 *)(uVar18 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar15 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          pCVar20 = (LPSTR)*puVar15;
          sVar16 = strlen(pCVar20);
          Count_00 = (iVar21 - Precision) + Fmt._4_4_;
          IVar17 = local_594 - (int)sVar16;
        }
LAB_001460fc:
        BVar5 = Internal_AddPaddingA((LPSTR *)&Precision,Count_00,pCVar20,IVar17,Flags_00);
        bVar24 = BVar5 == 0;
      }
      else {
        *_Precision = *_Type;
        _Type = _Type + 1;
        _Precision = _Precision + 1;
      }
LAB_0014610a:
      cVar4 = *_Type;
    } while (cVar4 != '\0');
    bVar24 = !bVar24;
  }
  if ((long)_Precision - (long)Buffer < lVar23) {
    *_Precision = '\0';
  }
  iVar6 = -1;
  if (bVar24) {
    iVar6 = Precision - iVar21;
  }
LAB_00146425:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

INT Silent_PAL_vsnprintf(LPSTR Buffer, INT Count, LPCSTR Format, va_list aparg)
{
    BOOL BufferRanOut = FALSE;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPSTR BufferPtr = Buffer;
    LPCSTR Fmt = Format;
    LPWSTR TempWStr;
    CHAR TempStr[MAX_STR_LEN+1];
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    va_list ap;
    
    va_copy(ap, aparg);

    while (*Fmt)
    {
        if ((BufferPtr - Buffer) >= Count)
        {
            BufferRanOut = TRUE;
            break;
        }
        else if(*Fmt == '%' &&
                TRUE == Silent_ExtractFormatA(&Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = Silent_WideCharToMultiByte(TempWStr, -1, 0, 0);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }

                /* clip string output to MAX_STR_LEN characters */
                if (PRECISION_DOT == Precision)
                {
                    Precision = MAX_STR_LEN;
                }

                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = Silent_WideCharToMultiByte(TempWStr, Precision, 
                                                        TempStr, Length);
                    if (!Length)
                    {
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = Silent_WideCharToMultiByte(TempWStr, -1,
                                                              TempStr, Length);
                    if (!wctombResult)
                    {
                        PAL_free(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempStr,
                                                   Width - Length,
                                                   Flags);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[4];

                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = Silent_WideCharToMultiByte(&TempWChar, 1, TempBuffer, 4);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempBuffer,
                                                   Width - Length,
                                                   Flags);

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = BufferPtr - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = BufferPtr - Buffer;
                }
            }
            else if (Type == PFF_TYPE_CHAR && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded chars,
                // so we handle them here.
                char ch[2];

                ch[0] = (char) va_arg(ap, int);
                ch[1] = '\0';
                Length = 1;
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           ch,
                                           Width - Length,
                                           Flags);
            }
            else if (Type == PFF_TYPE_STRING && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded strings,
                // so we handle them here.
                char *tempStr;

                tempStr = va_arg(ap, char *);
                Length = strlen(tempStr);
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           tempStr,
                                           Width - Length,
                                           Flags);
            }
            /* types that sprintf can handle */
            else
            {
                size_t TempCount = Count - (BufferPtr - Buffer);

                TempInt = 0;
                /* %h (short) doesn't seem to be handled properly by local sprintf,
                   so lets do the truncation ourselves.  (ptr -> int -> short to avoid
                   warnings */
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, trunc2);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, s);
                }
                else
                {
                    /* limit string output (%s) to 300 characters */
                    if(TempBuff[0] == '%' && TempBuff[1] == 's')
                    {
                        if (strcpy_s(TempBuff, sizeof(TempBuff), "%.300s") != SAFECRT_SUCCESS)
                        {
                            va_end(ap);
                            return -1;
                        }
                    }                                     
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = PAL__vsnprintf(BufferPtr, TempCount, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (TempInt < 0 || static_cast<size_t>(TempInt) >= TempCount) /* buffer not long enough */
                {
                    BufferPtr += TempCount;
                    BufferRanOut = TRUE;
                }
                else
                {
                    BufferPtr += TempInt;
                }
            }
        }
        else
        {
            *BufferPtr++ = *Fmt++; /* copy regular chars into buffer */
        }
    }

    if (Count > (BufferPtr - Buffer))
    {
        *BufferPtr = 0; /* end the string */
    }

    va_end(ap);

    if (BufferRanOut)
    {
        return -1;
    }
    else
    {
        return BufferPtr - Buffer;
    }
}